

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

PhysicalDeviceSelector * __thiscall
vkb::PhysicalDeviceSelector::add_required_extensions
          (PhysicalDeviceSelector *this,size_t count,char **extensions)

{
  char *__s;
  allocator<char> local_51;
  value_type local_50;
  char **local_30;
  size_t i;
  char **extensions_local;
  size_t count_local;
  PhysicalDeviceSelector *this_local;
  
  if ((extensions != (char **)0x0) && (count != 0)) {
    i = (size_t)extensions;
    extensions_local = (char **)count;
    count_local = (size_t)this;
    for (local_30 = (char **)0x0; local_30 < extensions_local;
        local_30 = (char **)((long)local_30 + 1)) {
      __s = *(char **)(i + (long)local_30 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->criteria).required_extensions,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
    }
  }
  return this;
}

Assistant:

PhysicalDeviceSelector& PhysicalDeviceSelector::add_required_extensions(size_t count, const char* const* extensions) {
    if (!extensions || count == 0) return *this;
    for (size_t i = 0; i < count; i++) {
        criteria.required_extensions.push_back(extensions[i]);
    }
    return *this;
}